

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O3

void ontostack(bucket_conflict1 *b,int pos)

{
  list *tail;
  list plVar1;
  list plVar2;
  stack *psVar3;
  int iVar4;
  
  plVar2 = b->tail;
  plVar2->next = (list)0x0;
  iVar4 = b->size;
  if (iVar4 < 0x15) {
    tail = &b->tail;
    if (1 < iVar4) {
      plVar2 = ListInsertsort(b->head,tail,pos);
      b->head = plVar2;
    }
    b->size = 0;
    psVar3 = stackp;
    if (stackp == (stack *)0x0) {
      plVar2 = *tail;
      iVar4 = 0;
    }
    else {
      iVar4 = 0;
      plVar2 = *tail;
      if (stackp->size == 0) {
        stackp->tail->next = b->head;
        psVar3->tail = plVar2;
        goto LAB_00251fed;
      }
    }
  }
  plVar1 = b->head;
  psVar3 = (stack *)allocmem(stackmem,0x18);
  stackp = psVar3;
  psVar3->head = plVar1;
  psVar3->tail = plVar2;
  psVar3->size = iVar4;
  psVar3->pos = pos;
  b->size = 0;
LAB_00251fed:
  b->head = (list)0x0;
  return;
}

Assistant:

static void ontostack(bucket *b, int pos)
{
   b->tail->next = NULL;
   if (b->size <= INSERTBREAK) {
      if (b->size > 1)
         b->head = ListInsertsort(b->head, &b->tail, pos);
      b->size = 0; /* finished */
   }
   if (!b->size && !stackempty() && !top()->size) {
      top()->tail->next = b->head;
      top()->tail = b->tail;
   }
   else {
      push(b->head, b->tail, b->size, pos);
      b->size = 0;
   }
   b->head = NULL;
}